

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void outchar_html_stream(out_stream_info *stream,uint htmlchar)

{
  uint in_ESI;
  char xlat_buf [50];
  amp_tbl_t *ampptr;
  char *in_stack_ffffffffffffffa8;
  out_stream_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  amp_tbl_t *local_18;
  
  for (local_18 = amp_tbl; (local_18 < &G_user_filter && (local_18->html_cval != in_ESI));
      local_18 = local_18 + 1) {
  }
  if ((local_18 < (amp_tbl_t *)0x44f570) && (local_18->expan != (char *)0x0)) {
    outstring_noxlat_stream(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    os_xlat_html4(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    outstring_noxlat_stream(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static void outchar_html_stream(out_stream_info *stream,
                                unsigned int htmlchar)
{
    struct amp_tbl_t *ampptr;

    /* 
     *   search for a mapping entry for this entity, in case it's defined
     *   in an external mapping file 
     */
    for (ampptr = amp_tbl ;
         ampptr < amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0]) ; ++ampptr)
    {
        /* if this is the one, stop looking */
        if (ampptr->html_cval == htmlchar)
            break;
    }

    /* 
     *   If we found a mapping table entry, and the entry has an expansion
     *   from the external character mapping table file, use the external
     *   expansion; otherwise, use the default expansion.  
     */
    if (ampptr >= amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0])
        || ampptr->expan == 0)
    {
        char xlat_buf[50];

        /* 
         *   there's no external mapping table file expansion -- use the
         *   default OS mapping routine 
         */
        os_xlat_html4(htmlchar, xlat_buf, sizeof(xlat_buf));
        outstring_noxlat_stream(stream, xlat_buf);
    }
    else
    {
        /* 
         *   use the explicit mapping from the mapping table file 
         */
        outstring_noxlat_stream(stream, ampptr->expan);
    }
}